

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination>::reallocateAndGrow
          (QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> *old)

{
  CloneDestination *pCVar1;
  QArrayData *pQVar2;
  bool bVar3;
  undefined7 uVar4;
  CloneDestination *pCVar5;
  CloneDestination *pCVar6;
  qsizetype qVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> *)0x0 && where == GrowsAtEnd)
  {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar3)) {
      if (pQVar2 == (QArrayData *)0x0) {
        qVar7 = 0;
        lVar8 = 0;
      }
      else {
        qVar7 = pQVar2->alloc;
        lVar8 = (this->size - pQVar2->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4);
      }
      auVar9 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,0x10,qVar7 + n + lVar8,Grow);
      this->d = (Data *)auVar9._0_8_;
      this->ptr = (CloneDestination *)auVar9._8_8_;
      goto LAB_00114564;
    }
  }
  local_38.size = -0x5555555555555556;
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (CloneDestination *)0xaaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar8 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pCVar5 = this->ptr;
    pCVar6 = pCVar5 + lVar8;
    if ((old != (QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> *)0x0) || (bVar3)) {
      if ((lVar8 != 0) && (0 < lVar8)) {
        do {
          bVar3 = pCVar5->cloneFlipPending;
          uVar4 = *(undefined7 *)&pCVar5->field_0x9;
          pCVar1 = local_38.ptr + local_38.size;
          pCVar1->screen = pCVar5->screen;
          pCVar1->cloneFlipPending = bVar3;
          *(undefined7 *)&pCVar1->field_0x9 = uVar4;
          pCVar5 = pCVar5 + 1;
          local_38.size = local_38.size + 1;
        } while (pCVar5 < pCVar6);
      }
    }
    else if ((lVar8 != 0) && (0 < lVar8)) {
      do {
        bVar3 = pCVar5->cloneFlipPending;
        uVar4 = *(undefined7 *)&pCVar5->field_0x9;
        pCVar1 = local_38.ptr + local_38.size;
        pCVar1->screen = pCVar5->screen;
        pCVar1->cloneFlipPending = bVar3;
        *(undefined7 *)&pCVar1->field_0x9 = uVar4;
        pCVar5 = pCVar5 + 1;
        local_38.size = local_38.size + 1;
      } while (pCVar5 < pCVar6);
    }
  }
  pQVar2 = &this->d->super_QArrayData;
  pCVar5 = this->ptr;
  *(undefined4 *)&this->d = local_38.d._0_4_;
  *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
  *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
  *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
  qVar7 = this->size;
  this->size = local_38.size;
  local_38.d = (Data *)pQVar2;
  local_38.ptr = pCVar5;
  local_38.size = qVar7;
  if (old != (QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = (Data *)pQVar2;
    old->ptr = pCVar5;
    local_38.size = old->size;
    old->size = qVar7;
  }
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x10,0x10);
    }
  }
LAB_00114564:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }